

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

int toktlsea(toktdef *tab1,char *name,int namel,int hash,toksdef *ret)

{
  code cVar1;
  int iVar2;
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *__src;
  int iVar3;
  
  iVar3 = *(int *)&tab1[1].toktfset;
  if (iVar3 != 0) {
    __src = tab1[1].toktfadd;
    do {
      cVar1 = __src[6];
      if (((uint)(byte)cVar1 == namel) &&
         (iVar2 = bcmp(__src + 7,name,(ulong)(uint)namel), iVar2 == 0)) {
        memcpy(ret,__src,(ulong)(uint)namel + 8);
        return 1;
      }
      __src = __src + ((byte)cVar1 + 0xf & 0xfffffff8);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return 0;
}

Assistant:

int toktlsea(toktdef *tab1, char *name, int namel, int hash, toksdef *ret)
{
    toksdef  *p;
    uint      cnt;
    toktldef *tab = (toktldef *)tab1;
    
    VARUSED(hash);
    
    for (p = (toksdef *)tab->toktlptr, cnt = tab->toktlcnt ; cnt ; --cnt )
    {
        if (p->tokslen == namel && !memcmp(p->toksnam, name, (size_t)namel))
        {
            memcpy(ret, p, (size_t)(sizeof(toks1def) + namel));
            return(TRUE);
        }
        
        p = (toksdef *)(((uchar *)p)
                        + osrndsz(p->tokslen + sizeof(toks1def)));
    }

    /* nothing found - indicate by returning FALSE */
    return(FALSE);
}